

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001bd080 = 0x2e2e2e2e2e2e2e;
    uRam00000000001bd087 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001bd070 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001bd078 = 0x2e2e2e2e2e2e2e;
    DAT_001bd07f = 0x2e;
    _DAT_001bd060 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001bd068 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001bd050 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001bd058 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001bd048 = 0x2e2e2e2e2e2e2e2e;
    DAT_001bd08f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}